

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::BufferStream::~BufferStream(BufferStream *this)

{
  BufferStream *in_RDI;
  
  ~BufferStream(in_RDI);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

~BufferStream() override = default;